

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_>_>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
appendPromise<kj::_::AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>,kj::_::PromiseDisposer,kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>
          (PromiseDisposer *this,OwnPromiseNode *next,
          Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *params)

{
  PromiseArena **this_00;
  PromiseNode *pPVar1;
  PromiseArena *pPVar2;
  RemoveConst<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *pRVar3;
  PromiseArena *pPVar4;
  
  pPVar1 = next->ptr;
  pPVar2 = (pPVar1->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x38) {
    alloc<kj::_::AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>
              (this,next,params);
  }
  else {
    (pPVar1->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = &pPVar1[-4].super_PromiseArenaMember.arena;
    AttachmentPromiseNodeBase::AttachmentPromiseNodeBase((AttachmentPromiseNodeBase *)this_00,next);
    pPVar1[-4].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006cbdc8;
    pRVar3 = (params->builder).pos;
    pPVar1[-2].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)(params->builder).ptr;
    pPVar1[-2].super_PromiseArenaMember.arena = (PromiseArena *)pRVar3;
    pPVar4 = (PromiseArena *)(params->builder).disposer;
    pPVar1[-1].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)(params->builder).endPtr;
    pPVar1[-1].super_PromiseArenaMember.arena = pPVar4;
    (params->builder).ptr = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)0x0;
    (params->builder).pos =
         (RemoveConst<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *)0x0;
    (params->builder).endPtr = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)0x0;
    pPVar1[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
    *(PromiseArena ***)this = this_00;
  }
  return (Own<kj::_::AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_>_>,_kj::_::PromiseDisposer>
          )(AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_>_>
            *)this;
}

Assistant:

static kj::Own<T, D> appendPromise(
      OwnPromiseNode&& next, Params&&... params) noexcept {
    // Append a promise to the arena that currently ends with `next`. `next` is also still passed as
    // the first parameter to the new object's constructor.
    //
    // This is semantically the same as `allocPromise()` except that it may avoid the underlying
    // memory allocation. `next` must end up being destroyed before the new object (i.e. the new
    // object must never transfer away ownership of `next`).


    PromiseArena* arena = next->arena;

    if (!canArenaAllocate<T>() || arena == nullptr ||
        reinterpret_cast<byte*>(next.get()) - reinterpret_cast<byte*>(arena) < sizeof(T)) {
      // No arena available, or not enough space, or weird alignment needed. Start new arena.
      return alloc<T, D>(kj::mv(next), kj::fwd<Params>(params)...);
    } else {
      // Append to arena.
      //
      // NOTE: When we call ctor(), it takes ownership of `next`, so we shouldn't assume `next`
      //   still exists after it returns. So we have to remove ownership of the arena before that.
      //   In theory if we wanted this to be exception-safe, we'd also have to arrange to delete
      //   the arena if the constructor throws. However, in practice none of the PromiseNode
      //   constructors throw, so we just mark the whole method noexcept in order to avoid the
      //   code bloat to handle this case.
      next->arena = nullptr;
      T* ptr = reinterpret_cast<T*>(next.get()) - 1;
      ctor(*ptr, kj::mv(next), kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
      return kj::Own<T, D>(ptr);
    }
  }